

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O2

void __thiscall soul::heart::Parser::parseOutput(Parser *this,OutputDeclaration *output)

{
  bool bVar1;
  uint32_t uVar2;
  EndpointType EVar3;
  Identifier IVar4;
  vector<soul::Type,_std::allocator<soul::Type>_> local_30;
  
  IVar4 = parseGeneralIdentifier(this);
  (output->super_IODeclaration).name.name = IVar4.name;
  bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matchIf<soul::TokenType>
                    (&this->
                      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                     ,(TokenType)0x2cada8);
  if (bVar1) {
    uVar2 = parseProcessorArraySize(this);
    (output->super_IODeclaration).arraySize.super__Optional_base<unsigned_int,_true,_true>.
    _M_payload.super__Optional_payload_base<unsigned_int> =
         (_Optional_payload_base<unsigned_int>)((ulong)uVar2 | 0x100000000);
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    expect<soul::TokenType>
              (&this->
                super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
               ,(TokenType)0x2a0190);
  }
  EVar3 = parseEndpointType<soul::heart::Parser>(this);
  (output->super_IODeclaration).endpointType = EVar3;
  readEventTypeList(&local_30,this);
  std::vector<soul::Type,_std::allocator<soul::Type>_>::_M_move_assign
            (&(output->super_IODeclaration).dataTypes,&local_30);
  std::vector<soul::Type,_std::allocator<soul::Type>_>::~vector(&local_30);
  IODeclaration::checkDataTypesValid<soul::CodeLocation&>
            (&output->super_IODeclaration,
             &(this->
              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
              ).location);
  parseAnnotation(this,&(output->super_IODeclaration).annotation);
  expectSemicolon(this);
  return;
}

Assistant:

void parseOutput (heart::OutputDeclaration& output)
    {
        output.name = parseGeneralIdentifier();

        if (matchIf (HEARTOperator::openBracket))
        {
            output.arraySize = parseProcessorArraySize();
            expect (HEARTOperator::closeBracket);
        }

        output.endpointType = parseEndpointType (*this);
        output.dataTypes = readEventTypeList();

        output.checkDataTypesValid (location);
        parseAnnotation (output.annotation);
        expectSemicolon();
    }